

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
deqp::gles3::Performance::anon_unknown_0::Utils::getFullscreenQuadWithGradient
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,float depth0,float depth1)

{
  float data [24];
  allocator_type local_69;
  undefined1 *local_68;
  float local_60;
  undefined8 local_5c;
  undefined4 local_54;
  float local_50;
  undefined8 local_4c;
  undefined4 local_44;
  float local_40;
  undefined8 local_3c;
  undefined4 local_34;
  float local_30;
  undefined8 local_2c;
  undefined4 local_24;
  float local_20;
  undefined1 *local_1c;
  undefined4 local_14;
  float local_10;
  undefined4 local_c;
  
  local_68 = &DAT_3f8000003f800000;
  local_5c = 0x3f80000000000000;
  local_54 = 0xbf800000;
  local_4c = 0xbf8000003f800000;
  local_44 = 0xbf800000;
  local_3c = 0xbf80000040000000;
  local_34 = 0xbf800000;
  local_2c = 0xbf80000000000000;
  local_24 = 0x3f800000;
  local_1c = &DAT_3f8000003f800000;
  local_14 = 0x3f800000;
  local_c = 0x40000000;
  local_60 = depth0;
  local_50 = depth0;
  local_40 = depth1;
  local_30 = depth1;
  local_20 = depth1;
  local_10 = depth0;
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)__return_storage_ptr__,(float *)&local_68,
             (float *)&stack0xfffffffffffffff8,&local_69);
  return __return_storage_ptr__;
}

Assistant:

vector<float> getFullscreenQuadWithGradient (float depth0, float depth1)
	{
		const float data[] =
		{
			+1.0f, +1.0f, depth0, 0.0f,
			+1.0f, -1.0f, depth0, 1.0f,
			-1.0f, -1.0f, depth1, 2.0f,
			-1.0f, -1.0f, depth1, 0.0f,
			-1.0f, +1.0f, depth1, 1.0f,
			+1.0f, +1.0f, depth0, 2.0f,
		};

		return vector<float>(DE_ARRAY_BEGIN(data), DE_ARRAY_END(data));
	}